

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O2

Vector<float,_16> *
deqp::gles3::Performance::arrTo16<16>
          (Vector<float,_16> *__return_storage_ptr__,Array<float,_16> *arr)

{
  int i;
  long lVar1;
  
  tcu::Vector<float,_16>::Vector(__return_storage_ptr__,0.0);
  for (lVar1 = 0; lVar1 != 0x10; lVar1 = lVar1 + 1) {
    __return_storage_ptr__->m_data[lVar1] = arr->m_data[lVar1];
  }
  return __return_storage_ptr__;
}

Assistant:

static tcu::Vector<float, 16> arrTo16 (const tcu::Array<float, Size>& arr)
{
	DE_STATIC_ASSERT(Size <= 16);

	tcu::Vector<float, 16> res(0.0f);

	for(int i = 0; i < Size; i++)
		res[i] = arr[i];

	return res;
}